

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O0

int __thiscall
CommandDrawInventoryBar::GetCounterSpacing(CommandDrawInventoryBar *this,DSBarInfo *statusBar)

{
  int iVar1;
  FTexture *local_40;
  int local_2c;
  int spacing;
  FTexture *box;
  DSBarInfo *statusBar_local;
  CommandDrawInventoryBar *this_local;
  
  if (this->style == STYLE_Strife) {
    local_40 = FImageCollection::operator[](&statusBar->Images,statusBar->invBarOffset + 2);
  }
  else {
    local_40 = FImageCollection::operator[](&statusBar->Images,statusBar->invBarOffset);
  }
  if (local_40 == (FTexture *)0x0) {
    this_local._4_4_ = 0x20;
  }
  else {
    if ((this->vertical & 1U) == 0) {
      local_2c = FTexture::GetScaledWidth(local_40);
    }
    else {
      local_2c = FTexture::GetScaledHeight(local_40);
    }
    iVar1 = -1;
    if (this->style != STYLE_Strife) {
      iVar1 = 1;
    }
    this_local._4_4_ = local_2c + iVar1;
  }
  return this_local._4_4_;
}

Assistant:

int GetCounterSpacing(const DSBarInfo *statusBar) const
		{
			FTexture *box = (style != STYLE_Strife)
				? statusBar->Images[statusBar->invBarOffset + imgARTIBOX]
				: statusBar->Images[statusBar->invBarOffset + imgCURSOR];
			if (box == NULL)
			{ // Don't crash without a graphic.
				return 32;
			}
			else
			{
				int spacing;
				if (!vertical)
				{
					spacing = box->GetScaledWidth();
				}
				else
				{
					spacing = box->GetScaledHeight();
				}
				return spacing + ((style != STYLE_Strife) ? 1 : -1);
			}
		}